

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall
QPropertyAnimation::QPropertyAnimation
          (QPropertyAnimation *this,QObject *target,QByteArray *propertyName,QObject *parent)

{
  QVariantAnimationPrivate *dd;
  QObject *in_RSI;
  QObject *in_RDI;
  QPropertyAnimationPrivate *in_stack_ffffffffffffffd0;
  QObject *this_00;
  
  this_00 = in_RDI;
  dd = (QVariantAnimationPrivate *)operator_new(0x188);
  QPropertyAnimationPrivate::QPropertyAnimationPrivate(in_stack_ffffffffffffffd0);
  QVariantAnimation::QVariantAnimation((QVariantAnimation *)in_stack_ffffffffffffffd0,dd,in_RDI);
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00be9d48;
  setTargetObject((QPropertyAnimation *)this_00,in_RSI);
  setPropertyName((QPropertyAnimation *)dd,(QByteArray *)in_RDI);
  return;
}

Assistant:

QPropertyAnimation::QPropertyAnimation(QObject *target, const QByteArray &propertyName, QObject *parent)
    : QVariantAnimation(*new QPropertyAnimationPrivate, parent)
{
    setTargetObject(target);
    setPropertyName(propertyName);
}